

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-remove-annotations.cc
# Opt level: O0

int realmain(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *this;
  reference pQVar3;
  QPDFUsage *e;
  exception *e_1;
  string local_90 [32];
  undefined1 local_70 [8];
  QPDFObjectHandle page;
  const_iterator __end1;
  const_iterator __begin1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__range1;
  QPDF *pdf;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> qpdf_sp;
  QPDFJob local_28 [8];
  QPDFJob j;
  char **argv_local;
  int argc_local;
  
  whoami = (char *)QUtil::getWhoami(*argv);
  QUtil::setLineBuf(_stdout);
  QPDFJob::QPDFJob(local_28);
  QPDFJob::initializeFromArgv((char **)local_28,(char *)argv);
  QPDFJob::createQPDF();
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::operator*
            ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&pdf);
  this = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)QPDF::getAllPages();
  __end1 = std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::begin(this);
  page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                *)&page.super_BaseHandle.obj.
                                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) break;
    pQVar3 = __gnu_cxx::
             __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
             ::operator*(&__end1);
    QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_70,pQVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_90,"/Annots",(allocator<char> *)((long)&e_1 + 7));
    QPDFObjectHandle::removeKey((string *)local_70);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)((long)&e_1 + 7));
    QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_70);
    __gnu_cxx::
    __normal_iterator<const_QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
    ::operator++(&__end1);
  }
  QPDFJob::writeQPDF((QPDF *)local_28);
  std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
            ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&pdf);
  iVar2 = QPDFJob::getExitCode();
  QPDFJob::~QPDFJob(local_28);
  return iVar2;
}

Assistant:

int
realmain(int argc, char* argv[])
{
    whoami = QUtil::getWhoami(argv[0]);
    QUtil::setLineBuf(stdout);

    QPDFJob j;
    try {
        // See "HOW TO ADD A COMMAND-LINE ARGUMENT" in README-maintainer.
        j.initializeFromArgv(argv);
        auto qpdf_sp = j.createQPDF();
        auto& pdf = *qpdf_sp;
        for (auto page: pdf.getAllPages()) {
            page.removeKey("/Annots");
        }
        j.writeQPDF(pdf);
    } catch (QPDFUsage& e) {
        usageExit(e.what());
    } catch (std::exception& e) {
        std::cerr << whoami << ": " << e.what() << '\n';
        return QPDFJob::EXIT_ERROR;
    }
    return j.getExitCode();
}